

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp1_fast_iVar5(uint *pInOut,int nWords,int *pDifStart)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = nWords * 2;
  iVar1 = 1;
  do {
    uVar2 = iVar4 - 2;
    if ((int)uVar2 < 0) {
      iVar4 = 0;
LAB_004d127c:
      *pDifStart = iVar4;
      return iVar1;
    }
    iVar3 = -(uint)(pInOut[uVar2] < pInOut[(ulong)uVar2 - 1]);
    if (pInOut[(ulong)uVar2 - 1] < pInOut[uVar2]) {
      iVar3 = iVar1;
    }
    if (iVar3 != 0) {
      if (iVar3 != -1) {
        iVar1 = 2;
      }
      goto LAB_004d127c;
    }
    iVar4 = iVar4 + -4;
  } while( true );
}

Assistant:

int minTemp1_fast_iVar5(unsigned* pInOut, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp1_fast_iVar5\n");
    for(i=(nWords)*2 - 2; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i],pInOut[i-1]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+2;
            return 1;
        }
        else
        {
            *pDifStart = i+2;
            return 2;
        }
    }
    *pDifStart=0;
    return 1;
}